

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  undefined1 *this_00;
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  this_00 = &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x60;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x60 = 0x92df00;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x48 = 0x92e040;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0xe8 = 0x92df28;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.Representation.have = 0x92df50;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.field_0x130
       = 0x92df78;
  *(undefined8 *)&this[-1].super_IfcBuildingElementComponent.field_0x160 = 0x92dfa0;
  *(undefined8 *)&this[-1].field_0x198 = 0x92dfc8;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x92dff0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x10 = 0x92e018;
  puVar1 = *(undefined1 **)
            &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x20;
  puVar2 = &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
            super_IfcProduct.super_IfcObject.field_0x30;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this_00,&PTR_construction_vtable_24__0092e068);
  operator_delete(this_00,0x1a8);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}